

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O3

bool __thiscall JSON::JSONScanner::IsJSONNumber(JSONScanner *this)

{
  char16 cVar1;
  bool bVar2;
  bool bVar3;
  char16 *pcVar4;
  char16 *pcVar5;
  bool bVar6;
  
  pcVar4 = this->currentChar;
  cVar1 = *pcVar4;
  if (cVar1 == L'0') {
    pcVar4 = pcVar4 + 1;
    this->currentChar = pcVar4;
  }
  bVar3 = cVar1 == L'0';
  while( true ) {
    bVar2 = bVar3;
    pcVar5 = pcVar4 + 1;
    bVar6 = this->inputText + this->inputLen <= pcVar4;
    if (bVar6) {
      return bVar6;
    }
    this->currentChar = pcVar5;
    cVar1 = *pcVar4;
    if (9 < (ushort)cVar1 - 0x30) break;
    pcVar4 = pcVar5;
    bVar3 = false;
    if (bVar2) {
      return bVar6;
    }
  }
  if (cVar1 == L'\0') {
    return bVar6;
  }
  if (cVar1 == L'.') {
    if (pcVar5 < this->inputText + this->inputLen) {
      this->currentChar = pcVar4 + 2;
      return (ushort)(*pcVar5 + L'￐') < 10;
    }
    return false;
  }
  return true;
}

Assistant:

bool JSONScanner::IsJSONNumber()
    {
        bool firstDigitIsAZero = false;
        if (PeekNextChar() == '0')
        {
            firstDigitIsAZero = true;
            currentChar++;
        }

        //partial verification of number JSON grammar.
        while (currentChar < inputText + inputLen)
        {
            switch(ReadNextChar())
            {
            case 0:
                return false;
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                if (firstDigitIsAZero)
                {
                    return false;
                }
                break;

            case '.':
                {
                    // at least one digit after '.'
                    if(currentChar < inputText + inputLen)
                    {
                        char16 nch = ReadNextChar();
                        if('0' <= nch && nch <= '9')
                        {
                            return true;
                        }
                        else
                        {
                            return false;
                        }
                    }
                    else
                    {
                        return false;
                    }
                }
                //case 'E':
                //case 'e':
                //    return true;
            default:
                return true;
            }

            firstDigitIsAZero = false;
        }
        return true;
    }